

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O2

void __thiscall just::test::test_manager::add(test_manager *this,string *name_,_func_void *f_)

{
  undefined1 local_38 [40];
  
  local_38._0_8_ = f_;
  std::__cxx11::string::string((string *)(local_38 + 8),(string *)name_);
  std::vector<just::test::test_case,_std::allocator<just::test::test_case>_>::
  emplace_back<just::test::test_case>(&this->_cases,(test_case *)local_38);
  std::__cxx11::string::~string((string *)(local_38 + 8));
  return;
}

Assistant:

void add(const std::string& name_, void (*f_)())
      {
        _cases.push_back(test_case(name_, f_));
      }